

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_2)

{
  long in_RSI;
  AssertionResult *in_RDI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_00000018;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_00000020;
  AssertionResult *in_stack_ffffffffffffffe0;
  
  (in_RDI->m_info).macroName.m_start = (char *)&PTR__AssertionStats_00263e98;
  AssertionResult::AssertionResult(in_stack_ffffffffffffffe0,in_RDI);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (in_stack_00000020,in_stack_00000018);
  memcpy(&in_RDI[1].m_info.lineInfo.line,(void *)(in_RSI + 0xc0),0x38);
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;